

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  uint uVar5;
  RepeatedField<int> *this;
  ulong uVar6;
  uint *puVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ulong uVar8;
  int value;
  char *pcVar9;
  ushort *puVar10;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  data_00 = data.field_0;
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  uVar2 = *(ushort *)ptr;
  uVar4 = *(undefined8 *)
           ((long)&table->has_bits_offset +
           ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  do {
    pcVar9 = (char *)(long)(char)*(ushort *)((long)ptr + 2);
    if ((long)pcVar9 < 0) {
      uVar6 = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)uVar6 < 0) {
        data_00.data = (long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff;
        if ((long)data_00 < 0) {
          uVar6 = uVar6 & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
          if ((long)uVar6 < 0) {
            data_00.data = data_00.data &
                           ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU);
            if ((long)data_00.data < 0) {
              uVar6 = uVar6 & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
              if ((long)uVar6 < 0) {
                data_00.data = data_00.data &
                               ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU);
                if ((long)data_00 < 0) {
                  uVar6 = uVar6 & ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar6 < 0) {
                    uVar8 = (ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff;
                    data_00.data = data_00.data & uVar8;
                    if ((long)data_00 < 0) {
                      puVar10 = (ushort *)((long)ptr + 0xc);
                      bVar1 = *(byte *)((long)ptr + 0xb);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar9 = Error(msg,pcVar9,
                                         (ParseContext *)CONCAT71((int7)(uVar8 >> 8),bVar1),
                                         (TcFieldData)data_00,table,hasbits);
                          return pcVar9;
                        }
                        if ((bVar1 & 1) == 0) {
                          data_00.data = data_00.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      puVar10 = (ushort *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    puVar10 = (ushort *)((long)ptr + 10);
                  }
                }
                else {
                  puVar10 = (ushort *)((long)ptr + 9);
                }
              }
              else {
                puVar10 = (ushort *)((long)ptr + 8);
              }
            }
            else {
              puVar10 = (ushort *)((long)ptr + 7);
            }
          }
          else {
            puVar10 = (ushort *)((long)ptr + 6);
          }
        }
        else {
          puVar10 = (ushort *)((long)ptr + 5);
        }
        uVar6 = uVar6 & data_00.data;
      }
      else {
        puVar10 = (ushort *)((long)ptr + 4);
      }
      pcVar9 = (char *)((ulong)pcVar9 & uVar6);
    }
    else {
      puVar10 = (ushort *)((long)ptr + 3);
    }
    value = (int)pcVar9;
    if ((value < (int)uVar4) || ((int)((ulong)uVar4 >> 0x20) < value)) {
      pcVar9 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar9;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar7 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar7 = *puVar7 | (uint)hasbits;
      }
      return (char *)puVar10;
    }
    uVar3 = *puVar10;
    data_00.data._2_6_ = 0;
    data_00.data._0_2_ = uVar3;
    ptr = (char *)puVar10;
  } while (uVar3 == uVar2);
  uVar5 = (uint)table->fast_idx_mask & (uint)uVar3;
  if ((uVar5 & 7) == 0) {
    uVar6 = (ulong)(uVar5 & 0xfffffff8);
    pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                               (msg,puVar10,ctx,
                                data_00.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table
                                ,hasbits);
    return pcVar9;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint16_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}